

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryManagerVk.cpp
# Opt level: O0

void __thiscall
Diligent::QueryManagerVk::QueryManagerVk
          (QueryManagerVk *this,RenderDeviceVkImpl *pRenderDeviceVk,Uint32 *QueryHeapSizes,
          SoftwareQueueIndex CmdQueueInd)

{
  uint32_t uVar1;
  bool bVar2;
  uint uVar3;
  Uint32 UVar4;
  Uint32 UVar5;
  QUERY_TYPE QVar6;
  VulkanLogicalDevice *this_00;
  VkPhysicalDeviceProperties *pVVar7;
  ICommandQueueVk *pIVar8;
  VkPhysicalDeviceFeatures *pVVar9;
  vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_> *pvVar10;
  const_reference pvVar11;
  RenderDeviceInfo *pRVar12;
  Char *pCVar13;
  ulong uVar14;
  char (*Args_1) [108];
  undefined1 local_f0 [8];
  string msg_1;
  value_type *PoolInfo;
  string msg;
  VkQueryPoolCreateInfo QueryPoolCI;
  QUERY_TYPE local_78;
  QUERY_TYPE QueryType;
  Uint32 query_type;
  bool QueueSupportsTimestamp;
  bool IsTransferQueue;
  RenderDeviceInfo *DeviceInfo;
  VkQueueFlags QueueFlags;
  VkPipelineStageFlags StageMask;
  VkPhysicalDeviceFeatures *EnabledFeatures;
  HardwareQueueIndex QueueFamilyIndex;
  VulkanPhysicalDevice *pVStack_48;
  float timestampPeriod;
  VulkanPhysicalDevice *PhysicalDevice;
  VulkanLogicalDevice *LogicalDevice;
  Uint32 *QueryHeapSizes_local;
  RenderDeviceVkImpl *pRenderDeviceVk_local;
  QueryManagerVk *this_local;
  SoftwareQueueIndex CmdQueueInd_local;
  
  (this->m_CommandQueueId).m_Value = CmdQueueInd.m_Value;
  std::array<Diligent::QueryManagerVk::QueryPoolInfo,_6UL>::array(&this->m_Pools);
  this->m_CounterFrequency = 0;
  this_00 = RenderDeviceVkImpl::GetLogicalDevice(pRenderDeviceVk);
  pVStack_48 = RenderDeviceVkImpl::GetPhysicalDevice(pRenderDeviceVk);
  pVVar7 = VulkanUtilities::VulkanPhysicalDevice::GetProperties(pVStack_48);
  EnabledFeatures._4_4_ = (pVVar7->limits).timestampPeriod;
  uVar14 = (ulong)(1e+09 / EnabledFeatures._4_4_);
  this->m_CounterFrequency =
       uVar14 | (long)(1e+09 / EnabledFeatures._4_4_ - 9.223372e+18) & (long)uVar14 >> 0x3f;
  EnabledFeatures._2_1_ = CmdQueueInd.m_Value;
  pIVar8 = RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
           ::GetCommandQueue(&pRenderDeviceVk->
                              super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                             ,CmdQueueInd);
  uVar3 = (*(pIVar8->super_ICommandQueue).super_IObject._vptr_IObject[0xc])();
  IndexWrapper<unsigned_char,Diligent::_HardwareQueueIndexTag>::
  IndexWrapper<unsigned_int,unsigned_int>
            ((IndexWrapper<unsigned_char,Diligent::_HardwareQueueIndexTag> *)
             ((long)&EnabledFeatures + 3),uVar3);
  pVVar9 = VulkanUtilities::VulkanLogicalDevice::GetEnabledFeatures(this_00);
  VulkanUtilities::VulkanLogicalDevice::GetSupportedStagesMask(this_00,EnabledFeatures._3_1_);
  pvVar10 = VulkanUtilities::VulkanPhysicalDevice::GetQueueProperties(pVStack_48);
  UVar4 = IndexWrapper::operator_cast_to_unsigned_int((IndexWrapper *)((long)&EnabledFeatures + 3));
  pvVar11 = std::vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>::
            operator[](pvVar10,(ulong)UVar4);
  uVar3 = pvVar11->queueFlags;
  pRVar12 = RenderDeviceBase<Diligent::EngineVkImplTraits>::GetDeviceInfo
                      ((RenderDeviceBase<Diligent::EngineVkImplTraits> *)pRenderDeviceVk);
  pvVar10 = VulkanUtilities::VulkanPhysicalDevice::GetQueueProperties(pVStack_48);
  UVar4 = IndexWrapper::operator_cast_to_unsigned_int((IndexWrapper *)((long)&EnabledFeatures + 3));
  pvVar11 = std::vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>::
            operator[](pvVar10,(ulong)UVar4);
  uVar1 = pvVar11->timestampValidBits;
  local_78 = QUERY_TYPE_OCCLUSION;
  do {
    if (QUERY_TYPE_DURATION < local_78) {
      return;
    }
    if (((local_78 != QUERY_TYPE_OCCLUSION) || (pVVar9->occlusionQueryPrecise != 0)) &&
       ((local_78 != QUERY_TYPE_PIPELINE_STATISTICS || (pVVar9->pipelineStatisticsQuery != 0)))) {
      if ((local_78 == QUERY_TYPE_TIMESTAMP) || (local_78 == QUERY_TYPE_DURATION)) {
        if ((uVar1 != 0) &&
           (((uVar3 & 3) != 0 ||
            ((pRVar12->Features).TransferQueueTimestampQueries != DEVICE_FEATURE_STATE_DISABLED))))
        goto LAB_0041bca1;
      }
      else if ((uVar3 & 1) != 0) {
LAB_0041bca1:
        msg.field_2._8_8_ = 0xb;
        switch(local_78) {
        case QUERY_TYPE_OCCLUSION:
        case QUERY_TYPE_BINARY_OCCLUSION:
          break;
        case QUERY_TYPE_TIMESTAMP:
        case QUERY_TYPE_DURATION:
          break;
        case QUERY_TYPE_PIPELINE_STATISTICS:
          break;
        default:
          FormatString<char[22]>((string *)&PoolInfo,(char (*) [22])"Unexpected query type");
          pCVar13 = (Char *)std::__cxx11::string::c_str();
          DebugAssertionFailed
                    (pCVar13,"QueryManagerVk",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/QueryManagerVk.cpp"
                     ,0xf1);
          std::__cxx11::string::~string((string *)&PoolInfo);
        }
        UVar4 = QueryHeapSizes[local_78];
        if (local_78 == QUERY_TYPE_DURATION) {
          UVar4 = UVar4 << 1;
        }
        msg_1.field_2._8_8_ =
             std::array<Diligent::QueryManagerVk::QueryPoolInfo,_6UL>::operator[]
                       (&this->m_Pools,(ulong)local_78);
        Args_1 = (char (*) [108])(ulong)local_78;
        QueryPoolInfo::Init((QueryPoolInfo *)msg_1.field_2._8_8_,this_00,
                            (VkQueryPoolCreateInfo *)((long)&msg.field_2 + 8),local_78);
        bVar2 = QueryPoolInfo::IsNull((QueryPoolInfo *)msg_1.field_2._8_8_);
        if (((bVar2) ||
            (UVar5 = QueryPoolInfo::GetQueryCount((QueryPoolInfo *)msg_1.field_2._8_8_),
            UVar5 != UVar4)) ||
           (QVar6 = QueryPoolInfo::GetType((QueryPoolInfo *)msg_1.field_2._8_8_), QVar6 != local_78)
           ) {
          FormatString<char[26],char[108]>
                    ((string *)local_f0,(Diligent *)"Debug expression failed:\n",
                     (char (*) [26])
                     "!PoolInfo.IsNull() && PoolInfo.GetQueryCount() == QueryPoolCI.queryCount && PoolInfo.GetType() == QueryType"
                     ,Args_1);
          pCVar13 = (Char *)std::__cxx11::string::c_str();
          DebugAssertionFailed
                    (pCVar13,"QueryManagerVk",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/QueryManagerVk.cpp"
                     ,0xfa);
          std::__cxx11::string::~string((string *)local_f0);
        }
      }
    }
    local_78 = local_78 + QUERY_TYPE_OCCLUSION;
  } while( true );
}

Assistant:

QueryManagerVk::QueryManagerVk(RenderDeviceVkImpl* pRenderDeviceVk,
                               const Uint32        QueryHeapSizes[],
                               SoftwareQueueIndex  CmdQueueInd) :
    m_CommandQueueId{CmdQueueInd}
{
    const auto& LogicalDevice  = pRenderDeviceVk->GetLogicalDevice();
    const auto& PhysicalDevice = pRenderDeviceVk->GetPhysicalDevice();

    auto timestampPeriod = PhysicalDevice.GetProperties().limits.timestampPeriod;
    m_CounterFrequency   = static_cast<Uint64>(1000000000.0 / timestampPeriod);

    const auto  QueueFamilyIndex       = HardwareQueueIndex{pRenderDeviceVk->GetCommandQueue(CmdQueueInd).GetQueueFamilyIndex()};
    const auto& EnabledFeatures        = LogicalDevice.GetEnabledFeatures();
    const auto  StageMask              = LogicalDevice.GetSupportedStagesMask(QueueFamilyIndex);
    const auto  QueueFlags             = PhysicalDevice.GetQueueProperties()[QueueFamilyIndex].queueFlags;
    const auto& DeviceInfo             = pRenderDeviceVk->GetDeviceInfo();
    const bool  IsTransferQueue        = (QueueFlags & (VK_QUEUE_COMPUTE_BIT | VK_QUEUE_GRAPHICS_BIT)) == 0;
    const bool  QueueSupportsTimestamp = PhysicalDevice.GetQueueProperties()[QueueFamilyIndex].timestampValidBits > 0;

    for (Uint32 query_type = QUERY_TYPE_UNDEFINED + 1; query_type < QUERY_TYPE_NUM_TYPES; ++query_type)
    {
        const auto QueryType = static_cast<QUERY_TYPE>(query_type);
        if ((QueryType == QUERY_TYPE_OCCLUSION && !EnabledFeatures.occlusionQueryPrecise) ||
            (QueryType == QUERY_TYPE_PIPELINE_STATISTICS && !EnabledFeatures.pipelineStatisticsQuery))
            continue;

        // Time and duration queries are supported in all queues
        if (QueryType == QUERY_TYPE_TIMESTAMP || QueryType == QUERY_TYPE_DURATION)
        {
            if (!QueueSupportsTimestamp)
                continue;

            if (IsTransferQueue && !DeviceInfo.Features.TransferQueueTimestampQueries)
                continue; // Not supported in transfer queue
        }
        // Other queries are supported only in graphics queue
        else if ((QueueFlags & VK_QUEUE_GRAPHICS_BIT) == 0)
            continue;


        // clang-format off
        static_assert(QUERY_TYPE_OCCLUSION          == 1, "Unexpected value of QUERY_TYPE_OCCLUSION. EngineVkCreateInfo::QueryPoolSizes must be updated");
        static_assert(QUERY_TYPE_BINARY_OCCLUSION   == 2, "Unexpected value of QUERY_TYPE_BINARY_OCCLUSION. EngineVkCreateInfo::QueryPoolSizes must be updated");
        static_assert(QUERY_TYPE_TIMESTAMP          == 3, "Unexpected value of QUERY_TYPE_TIMESTAMP. EngineVkCreateInfo::QueryPoolSizes must be updated");
        static_assert(QUERY_TYPE_PIPELINE_STATISTICS== 4, "Unexpected value of QUERY_TYPE_PIPELINE_STATISTICS. EngineVkCreateInfo::QueryPoolSizes must be updated");
        static_assert(QUERY_TYPE_DURATION           == 5, "Unexpected value of QUERY_TYPE_DURATION. EngineVkCreateInfo::QueryPoolSizes must be updated");
        static_assert(QUERY_TYPE_NUM_TYPES          == 6, "Unexpected value of QUERY_TYPE_NUM_TYPES. EngineVkCreateInfo::QueryPoolSizes must be updated");
        // clang-format on

        VkQueryPoolCreateInfo QueryPoolCI{};
        QueryPoolCI.sType = VK_STRUCTURE_TYPE_QUERY_POOL_CREATE_INFO;
        QueryPoolCI.pNext = nullptr;
        QueryPoolCI.flags = 0;

        static_assert(QUERY_TYPE_NUM_TYPES == 6, "Not all QUERY_TYPE enum values are handled below");
        switch (QueryType)
        {
            case QUERY_TYPE_OCCLUSION:
            case QUERY_TYPE_BINARY_OCCLUSION:
                QueryPoolCI.queryType = VK_QUERY_TYPE_OCCLUSION;
                break;

            case QUERY_TYPE_TIMESTAMP:
            case QUERY_TYPE_DURATION:
                QueryPoolCI.queryType = VK_QUERY_TYPE_TIMESTAMP;
                break;

            case QUERY_TYPE_PIPELINE_STATISTICS:
            {
                QueryPoolCI.queryType = VK_QUERY_TYPE_PIPELINE_STATISTICS;
                QueryPoolCI.pipelineStatistics =
                    VK_QUERY_PIPELINE_STATISTIC_INPUT_ASSEMBLY_VERTICES_BIT |
                    VK_QUERY_PIPELINE_STATISTIC_INPUT_ASSEMBLY_PRIMITIVES_BIT |
                    VK_QUERY_PIPELINE_STATISTIC_VERTEX_SHADER_INVOCATIONS_BIT |
                    VK_QUERY_PIPELINE_STATISTIC_CLIPPING_INVOCATIONS_BIT |
                    VK_QUERY_PIPELINE_STATISTIC_CLIPPING_PRIMITIVES_BIT |
                    VK_QUERY_PIPELINE_STATISTIC_FRAGMENT_SHADER_INVOCATIONS_BIT |
                    VK_QUERY_PIPELINE_STATISTIC_COMPUTE_SHADER_INVOCATIONS_BIT;

                if (StageMask & VK_PIPELINE_STAGE_GEOMETRY_SHADER_BIT)
                {
                    QueryPoolCI.pipelineStatistics |=
                        VK_QUERY_PIPELINE_STATISTIC_GEOMETRY_SHADER_INVOCATIONS_BIT |
                        VK_QUERY_PIPELINE_STATISTIC_GEOMETRY_SHADER_PRIMITIVES_BIT;
                }
                if (StageMask & VK_PIPELINE_STAGE_TESSELLATION_CONTROL_SHADER_BIT)
                    QueryPoolCI.pipelineStatistics |= VK_QUERY_PIPELINE_STATISTIC_TESSELLATION_CONTROL_SHADER_PATCHES_BIT;
                if (StageMask & VK_PIPELINE_STAGE_TESSELLATION_EVALUATION_SHADER_BIT)
                    QueryPoolCI.pipelineStatistics |= VK_QUERY_PIPELINE_STATISTIC_TESSELLATION_EVALUATION_SHADER_INVOCATIONS_BIT;
            }
            break;

            default:
                UNEXPECTED("Unexpected query type");
        }

        QueryPoolCI.queryCount = QueryHeapSizes[QueryType];
        if (QueryType == QUERY_TYPE_DURATION)
            QueryPoolCI.queryCount *= 2;

        auto& PoolInfo = m_Pools[QueryType];
        PoolInfo.Init(LogicalDevice, QueryPoolCI, QueryType);
        VERIFY_EXPR(!PoolInfo.IsNull() && PoolInfo.GetQueryCount() == QueryPoolCI.queryCount && PoolInfo.GetType() == QueryType);
    }
}